

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tracker.cc
# Opt level: O2

vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_> *
google::protobuf::compiler::cpp::MakeTrackerCalls
          (vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
           *__return_storage_ptr__,Descriptor *message,Options *opts)

{
  Span<const_google::protobuf::compiler::cpp::(anonymous_namespace)::Call> calls;
  size_type sVar1;
  long lVar2;
  bool bVar3;
  string_view var;
  string_view var_00;
  string_view var_01;
  string_view var_02;
  string_view var_03;
  string_view var_04;
  string_view var_05;
  string_view var_06;
  string_view format;
  string_view var_07;
  string_view var_08;
  string_view var_09;
  string_view var_10;
  string_view var_11;
  string_view var_12;
  string_view var_13;
  string_view var_14;
  string_view var_15;
  string_view var_16;
  string_view var_17;
  string_view var_18;
  string_view var_19;
  string_view call;
  string_view call_00;
  string_view call_01;
  string_view call_02;
  string_view call_03;
  string_view call_04;
  string_view call_05;
  string_view call_06;
  string_view call_07;
  string_view call_08;
  string_view call_09;
  string_view call_10;
  string_view call_11;
  string_view call_12;
  string_view call_13;
  string_view call_14;
  string_view call_15;
  string_view call_16;
  string_view call_17;
  string_view call_18;
  string_view call_19;
  anon_class_16_1_a7e182c6 local_b80;
  anon_class_16_1_a7e182c6 local_b70;
  Options *local_b60;
  Options *local_b58;
  anon_class_16_1_a7e182c6 local_b50;
  undefined1 local_b40 [40];
  _Storage<std::basic_string_view<char,_std::char_traits<char>_>,_true> local_b18;
  FeatureSet *local_b08;
  _Storage<std::basic_string_view<char,_std::char_traits<char>_>,_true> local_b00;
  Descriptor *local_af0;
  Call local_ae8;
  _Storage<std::basic_string_view<char,_std::char_traits<char>_>,_true> local_a88;
  bool local_a78;
  undefined7 uStack_a77;
  Call local_a70;
  _Storage<std::basic_string_view<char,_std::char_traits<char>_>,_true> local_a10;
  bool local_a00;
  undefined7 uStack_9ff;
  Call local_9f8;
  undefined1 local_998 [64];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_958;
  bool local_940;
  Call local_938;
  undefined1 local_8d8 [64];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_898;
  bool local_880;
  undefined1 local_878 [64];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_838;
  bool local_820;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_818;
  _Optional_payload_base<int> local_7f8;
  size_t sStack_7f0;
  char *local_7e8;
  bool local_7e0;
  undefined7 uStack_7df;
  pointer local_7d8;
  pointer pbStack_7d0;
  pointer local_7c8;
  undefined1 local_7c0;
  size_t local_7b8;
  char *pcStack_7b0;
  size_t local_7a8;
  char *pcStack_7a0;
  _Optional_payload_base<int> local_798;
  size_t sStack_790;
  char *local_788;
  bool local_780;
  undefined7 uStack_77f;
  pointer local_778;
  pointer pbStack_770;
  pointer local_768;
  undefined1 local_760;
  EnumDescriptor *local_758;
  ExtensionRange *pEStack_750;
  FieldDescriptor *local_748;
  ReservedRange *pRStack_740;
  _Optional_payload_base<int> local_738;
  size_t sStack_730;
  char *local_728;
  undefined1 local_720;
  undefined4 local_71f;
  undefined2 local_71b;
  undefined1 local_719;
  pointer local_718;
  pointer pbStack_710;
  pointer local_708;
  undefined1 local_700;
  size_t local_6f8;
  char *pcStack_6f0;
  size_t local_6e8;
  char *pcStack_6e0;
  _Optional_payload_base<int> local_6d8;
  size_t sStack_6d0;
  char *local_6c8;
  Descriptor *local_6c0;
  pointer local_6b8;
  pointer pbStack_6b0;
  pointer local_6a8;
  undefined1 local_6a0;
  Call local_698;
  Call local_638;
  Call local_5d8;
  Call local_578;
  Call local_518;
  Call local_4b8;
  Call local_458;
  Call local_3f8;
  Call local_398;
  Call local_338;
  Call local_2d8;
  Call local_278;
  Call local_218;
  Call local_1b8;
  Call local_158;
  Call local_f8;
  size_t local_98;
  char *pcStack_90;
  size_t local_88;
  char *pcStack_80;
  _Optional_payload_base<int> local_78;
  size_t sStack_70;
  char *local_68;
  bool bStack_60;
  undefined7 uStack_5f;
  pointer local_58;
  pointer pbStack_50;
  pointer local_48;
  undefined1 local_40;
  
  bVar3 = (message->options_->field_0)._impl_.map_entry_ != false;
  local_b80.extns._M_str = "_impl_._extensions_";
  if (bVar3) {
    local_b80.extns._M_str = "_extensions_";
  }
  sVar1 = 0x13;
  if (bVar3) {
    sVar1 = 0xc;
  }
  local_b40[0x20] = false;
  var._M_str = "serialize";
  var._M_len = 9;
  call._M_str = "OnSerialize";
  call._M_len = 0xb;
  local_b80.extns._M_len = sVar1;
  local_b70.extns._M_len = sVar1;
  local_b70.extns._M_str = local_b80.extns._M_str;
  local_b60 = opts;
  local_b58 = (Options *)message;
  local_b50.extns._M_len = sVar1;
  local_b50.extns._M_str = local_b80.extns._M_str;
  anon_unknown_0::Call::Call(&local_9f8,var,call);
  std::optional<std::basic_string_view<char,_std::char_traits<char>_>_>::
  optional<const_char_(&)[7],_true>
            ((optional<std::basic_string_view<char,_std::char_traits<char>_>_> *)&local_a10._M_value
             ,(char (*) [7])"&this_");
  local_9f8.thiz.
  super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>._M_payload
  .super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>._M_payload.
  _M_value._M_len = local_a10._M_value._M_len;
  local_9f8.thiz.
  super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>._M_payload
  .super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>._M_payload.
  _M_value._M_str = local_a10._M_value._M_str;
  local_9f8.thiz.
  super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>._M_payload
  .super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>._M_engaged =
       local_a00;
  local_9f8.thiz.
  super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>._M_payload
  .super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>._17_7_ =
       uStack_9ff;
  local_818._M_value._M_dataplus._M_p = (_Alloc_hider)(_Alloc_hider)local_9f8.var._M_len;
  local_818._M_value._M_string_length = (size_type)local_9f8.var._M_str;
  local_818._16_8_ = local_9f8.call._M_len;
  local_818._24_8_ = local_9f8.call._M_str;
  local_7f8 = (_Optional_payload_base<int>)
              local_9f8.field_index.super__Optional_base<int,_true,_true>._M_payload.
              super__Optional_payload_base<int>;
  sStack_7f0 = local_a10._M_value._M_len;
  local_7e8 = local_a10._M_value._M_str;
  local_7e0 = local_a00;
  uStack_7df = uStack_9ff;
  local_7d8 = local_9f8.args.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  pbStack_7d0 = local_9f8.args.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
  local_7c8 = local_9f8.args.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_9f8.args.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_9f8.args.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_9f8.args.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_7c0 = local_9f8.suppressed;
  var_00._M_str = "deserialize";
  var_00._M_len = 0xb;
  call_00._M_str = "OnDeserialize";
  call_00._M_len = 0xd;
  anon_unknown_0::Call::Call(&local_a70,var_00,call_00);
  std::optional<std::basic_string_view<char,_std::char_traits<char>_>_>::
  optional<const_char_(&)[6],_true>
            ((optional<std::basic_string_view<char,_std::char_traits<char>_>_> *)&local_a88._M_value
             ,(char (*) [6])0x1017aff);
  local_768 = local_a70.args.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_a70.thiz.
  super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>._M_payload
  .super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>._M_payload.
  _M_value._M_len = local_a88._M_value._M_len;
  local_a70.thiz.
  super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>._M_payload
  .super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>._M_payload.
  _M_value._M_str = local_a88._M_value._M_str;
  local_a70.thiz.
  super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>._M_payload
  .super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>._M_engaged =
       local_a78;
  local_a70.thiz.
  super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>._M_payload
  .super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>._17_7_ =
       uStack_a77;
  local_7b8 = local_a70.var._M_len;
  pcStack_7b0 = local_a70.var._M_str;
  local_7a8 = local_a70.call._M_len;
  pcStack_7a0 = local_a70.call._M_str;
  local_798 = (_Optional_payload_base<int>)
              local_a70.field_index.super__Optional_base<int,_true,_true>._M_payload.
              super__Optional_payload_base<int>;
  sStack_790 = local_a88._M_value._M_len;
  local_788 = local_a88._M_value._M_str;
  local_780 = local_a78;
  uStack_77f = uStack_a77;
  local_778 = local_a70.args.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  pbStack_770 = local_a70.args.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
  local_a70.args.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_a70.args.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_a70.args.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_760 = local_a70.suppressed;
  var_01._M_str = "reflection";
  var_01._M_len = 10;
  call_01._M_str = "OnGetMetadata";
  call_01._M_len = 0xd;
  anon_unknown_0::Call::Call(&local_ae8,var_01,call_01);
  local_708 = local_ae8.args.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_ae8.thiz.
  super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>._M_payload
  .super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>._M_engaged =
       false;
  local_758 = (EnumDescriptor *)local_ae8.var._M_len;
  pEStack_750 = (ExtensionRange *)local_ae8.var._M_str;
  local_748 = (FieldDescriptor *)local_ae8.call._M_len;
  pRStack_740 = (ReservedRange *)local_ae8.call._M_str;
  local_738 = (_Optional_payload_base<int>)
              local_ae8.field_index.super__Optional_base<int,_true,_true>._M_payload.
              super__Optional_payload_base<int>;
  sStack_730 = local_ae8.thiz.
               super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>
               ._M_payload.
               super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
               _M_payload._M_value._M_len;
  local_728 = local_ae8.thiz.
              super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>
              ._M_payload.
              super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
              _M_payload._M_value._M_str;
  local_720 = 0;
  local_71f = local_ae8.thiz.
              super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>
              ._M_payload.
              super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
              _17_4_;
  local_71b = local_ae8.thiz.
              super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>
              ._M_payload.
              super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
              _21_2_;
  local_719 = local_ae8.thiz.
              super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>
              ._M_payload.
              super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
              _23_1_;
  local_718 = local_ae8.args.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  pbStack_710 = local_ae8.args.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
  local_ae8.args.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_ae8.args.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_ae8.args.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_700 = local_ae8.suppressed;
  var_02._M_str = "bytesize";
  var_02._M_len = 8;
  call_02._M_str = "OnByteSize";
  call_02._M_len = 10;
  anon_unknown_0::Call::Call((Call *)local_878,var_02,call_02);
  std::optional<std::basic_string_view<char,_std::char_traits<char>_>_>::
  optional<const_char_(&)[7],_true>
            ((optional<std::basic_string_view<char,_std::char_traits<char>_>_> *)&local_b00._M_value
             ,(char (*) [7])"&this_");
  local_6a8 = local_838.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_878._40_8_ = local_b00._M_value._M_len;
  local_878._48_8_ = local_b00._M_value._M_str;
  local_878._56_8_ = local_af0;
  local_6f8 = local_878._0_8_;
  pcStack_6f0 = (char *)local_878._8_8_;
  local_6e8 = local_878._16_8_;
  pcStack_6e0 = (char *)local_878._24_8_;
  local_6d8._M_payload = (_Storage<int,_true>)local_878._32_4_;
  local_6d8._M_engaged = (bool)local_878[0x24];
  local_6d8._5_3_ = local_878._37_3_;
  sStack_6d0 = local_b00._M_value._M_len;
  local_6c8 = local_b00._M_value._M_str;
  local_6c0 = local_af0;
  local_6b8 = local_838.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  pbStack_6b0 = local_838.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
  local_838.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_838.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_838.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_6a0 = local_820;
  var_03._M_str = "mergefrom";
  var_03._M_len = 9;
  call_03._M_str = "OnMergeFrom";
  call_03._M_len = 0xb;
  anon_unknown_0::Call::Call((Call *)local_8d8,var_03,call_03);
  std::optional<std::basic_string_view<char,_std::char_traits<char>_>_>::
  optional<const_char_(&)[6],_true>
            ((optional<std::basic_string_view<char,_std::char_traits<char>_>_> *)&local_b18._M_value
             ,(char (*) [6])0x1017aff);
  local_958.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_898.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_8d8._40_8_ = local_b18._M_value._M_len;
  local_8d8._48_8_ = local_b18._M_value._M_str;
  local_8d8._56_8_ = local_b08;
  local_998._0_8_ = local_8d8._0_8_;
  local_998._8_8_ = local_8d8._8_8_;
  local_998._16_8_ = local_8d8._16_8_;
  local_998._24_8_ = local_8d8._24_8_;
  local_998._32_8_ = local_8d8._32_8_;
  local_998._40_8_ = local_b18._M_value._M_len;
  local_998._48_8_ = local_b18._M_value._M_str;
  local_998._56_8_ = local_b08;
  local_958.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_898.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_958.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_898.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_898.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_898.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_898.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_940 = local_880;
  format._M_str = "&from";
  format._M_len = 5;
  anon_unknown_0::Call::Arg<>(&local_698,(Call *)local_998,format);
  var_04._M_str = "unknown_fields";
  var_04._M_len = 0xe;
  call_04._M_str = "OnUnknownFields";
  call_04._M_len = 0xf;
  anon_unknown_0::Call::Call(&local_638,var_04,call_04);
  var_05._M_str = "mutable_unknown_fields";
  var_05._M_len = 0x16;
  call_05._M_str = "OnMutableUnknownFields";
  call_05._M_len = 0x16;
  anon_unknown_0::Call::Call(&local_5d8,var_05,call_05);
  var_07._M_str = "extension_has";
  var_07._M_len = 0xd;
  call_07._M_str = "OnHasExtension";
  call_07._M_len = 0xe;
  MakeTrackerCalls::anon_class_16_1_a7e182c6::operator()
            (&local_578,(anon_class_16_1_a7e182c6 *)&stack0xfffffffffffff470,var_07,call_07);
  var_08._M_str = "extension_get";
  var_08._M_len = 0xd;
  call_08._M_str = "OnGetExtension";
  call_08._M_len = 0xe;
  MakeTrackerCalls::anon_class_16_1_a7e182c6::operator()
            (&local_518,(anon_class_16_1_a7e182c6 *)&stack0xfffffffffffff470,var_08,call_08);
  var_09._M_str = "extension_mutable";
  var_09._M_len = 0x11;
  call_09._M_str = "OnMutableExtension";
  call_09._M_len = 0x12;
  MakeTrackerCalls::anon_class_16_1_a7e182c6::operator()
            (&local_4b8,(anon_class_16_1_a7e182c6 *)&stack0xfffffffffffff470,var_09,call_09);
  var_10._M_str = "extension_set";
  var_10._M_len = 0xd;
  call_10._M_str = "OnSetExtension";
  call_10._M_len = 0xe;
  MakeTrackerCalls::anon_class_16_1_a7e182c6::operator()
            (&local_458,(anon_class_16_1_a7e182c6 *)&stack0xfffffffffffff470,var_10,call_10);
  var_11._M_str = "extension_release";
  var_11._M_len = 0x11;
  call_11._M_str = "OnReleaseExtension";
  call_11._M_len = 0x12;
  MakeTrackerCalls::anon_class_16_1_a7e182c6::operator()
            (&local_3f8,(anon_class_16_1_a7e182c6 *)&stack0xfffffffffffff470,var_11,call_11);
  var_12._M_str = "repeated_extension_get";
  var_12._M_len = 0x16;
  call_12._M_str = "OnGetExtension";
  call_12._M_len = 0xe;
  MakeTrackerCalls::anon_class_16_1_a7e182c6::operator()(&local_398,&local_b70,var_12,call_12);
  var_13._M_str = "repeated_extension_mutable";
  var_13._M_len = 0x1a;
  call_13._M_str = "OnMutableExtension";
  call_13._M_len = 0x12;
  MakeTrackerCalls::anon_class_16_1_a7e182c6::operator()(&local_338,&local_b70,var_13,call_13);
  var_14._M_str = "repeated_extension_set";
  var_14._M_len = 0x16;
  call_14._M_str = "OnSetExtension";
  call_14._M_len = 0xe;
  MakeTrackerCalls::anon_class_16_1_a7e182c6::operator()(&local_2d8,&local_b70,var_14,call_14);
  var_15._M_str = "repeated_extension_add";
  var_15._M_len = 0x16;
  call_15._M_str = "OnAddExtension";
  call_15._M_len = 0xe;
  MakeTrackerCalls::anon_class_16_1_a7e182c6::operator()(&local_278,&local_b50,var_15,call_15);
  var_16._M_str = "repeated_extension_add_mutable";
  var_16._M_len = 0x1e;
  call_16._M_str = "OnAddMutableExtension";
  call_16._M_len = 0x15;
  MakeTrackerCalls::anon_class_16_1_a7e182c6::operator()(&local_218,&local_b50,var_16,call_16);
  var_17._M_str = "extension_repeated_size";
  var_17._M_len = 0x17;
  call_17._M_str = "OnExtensionSize";
  call_17._M_len = 0xf;
  MakeTrackerCalls::anon_class_16_1_a7e182c6::operator()(&local_1b8,&local_b80,var_17,call_17);
  var_18._M_str = "repeated_extension_list";
  var_18._M_len = 0x17;
  call_18._M_str = "OnListExtension";
  call_18._M_len = 0xf;
  MakeTrackerCalls::anon_class_16_1_a7e182c6::operator()(&local_158,&local_b80,var_18,call_18);
  var_19._M_str = "repeated_extension_list_mutable";
  var_19._M_len = 0x1f;
  call_19._M_str = "OnMutableListExtension";
  call_19._M_len = 0x16;
  MakeTrackerCalls::anon_class_16_1_a7e182c6::operator()(&local_f8,&local_b80,var_19,call_19);
  var_06._M_str = "extension_clear";
  var_06._M_len = 0xf;
  call_06._M_str = "OnClearExtension";
  call_06._M_len = 0x10;
  anon_unknown_0::Call::Call(&local_938,var_06,call_06);
  local_938.suppressed = true;
  local_98 = local_938.var._M_len;
  pcStack_90 = local_938.var._M_str;
  local_88 = local_938.call._M_len;
  pcStack_80 = local_938.call._M_str;
  local_78 = (_Optional_payload_base<int>)
             local_938.field_index.super__Optional_base<int,_true,_true>._M_payload.
             super__Optional_payload_base<int>;
  sStack_70 = local_938.thiz.
              super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>
              ._M_payload.
              super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
              _M_payload._M_value._M_len;
  local_68 = local_938.thiz.
             super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>
             ._M_payload.
             super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
             _M_payload._M_value._M_str;
  bStack_60 = local_938.thiz.
              super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>
              ._M_payload.
              super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
              _M_engaged;
  uStack_5f = local_938.thiz.
              super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>
              ._M_payload.
              super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
              _17_7_;
  local_58 = local_938.args.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
  pbStack_50 = local_938.args.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
  local_48 = local_938.args.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_938.args.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_938.args.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_938.args.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_40 = 1;
  calls.len_ = sVar1;
  calls.ptr_ = (pointer)__return_storage_ptr__;
  anon_unknown_0::GenerateTrackerCalls
            (__return_storage_ptr__,(anon_unknown_0 *)local_b60,local_b58,(Descriptor *)local_b40,
             (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_818._M_value,calls);
  lVar2 = 0x7c0;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&local_818 + lVar2));
    lVar2 = lVar2 + -0x60;
  } while (lVar2 != -0x20);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_938.args);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_958);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_898);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_838);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_ae8.args);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_a70.args);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_9f8.args);
  std::
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::_M_reset((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_b40);
  return (vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
          *)(pointer)__return_storage_ptr__;
}

Assistant:

std::vector<Sub> MakeTrackerCalls(const Descriptor* message,
                                  const Options& opts) {
  absl::string_view extns =
      IsMapEntryMessage(message) ? "_extensions_" : "_impl_._extensions_";

  auto primitive_extn_accessor = [extns](absl::string_view var,
                                         absl::string_view call) {
    return Call(var, call)
        .Arg("id.number()")
        .Arg("$0::GetPtr(id.number(), $1, id.default_value_ref())", kTypeTraits,
             extns);
  };

  auto index_extn_accessor = [extns](absl::string_view var,
                                     absl::string_view call) {
    return Call(var, call)
        .Arg("id.number()")
        .Arg("$0::GetPtr(id.number(), $1, index)", kTypeTraits, extns);
  };

  auto add_extn_accessor = [extns](absl::string_view var,
                                   absl::string_view call) {
    return Call(var, call)
        .Arg("id.number()")
        .Arg("$0::GetPtr(id.number(), $1, $1.ExtensionSize(id.number()) - 1)",
             kTypeTraits, extns);
  };

  auto list_extn_accessor = [extns](absl::string_view var,
                                    absl::string_view call) {
    return Call(var, call)
        .Arg("id.number()")
        .Arg("$0::GetRepeatedPtr(id.number(), $1)", kTypeTraits, extns);
  };

  return GenerateTrackerCalls(
      opts, message, absl::nullopt,
      {
          Call("serialize", "OnSerialize").This("&this_"),
          Call("deserialize", "OnDeserialize").This("_this"),
          // TODO: Ideally annotate_reflection should not exist and we
          // need to annotate all reflective calls on our own, however, as this
          // is a cause for side effects, i.e. reading values dynamically, we
          // want the users know that dynamic access can happen.
          Call("reflection", "OnGetMetadata").This(absl::nullopt),
          Call("bytesize", "OnByteSize").This("&this_"),
          Call("mergefrom", "OnMergeFrom").This("_this").Arg("&from"),
          Call("unknown_fields", "OnUnknownFields"),
          Call("mutable_unknown_fields", "OnMutableUnknownFields"),

          // "Has" is here as users calling "has" on a repeated field is a
          // mistake.
          primitive_extn_accessor("extension_has", "OnHasExtension"),
          primitive_extn_accessor("extension_get", "OnGetExtension"),
          primitive_extn_accessor("extension_mutable", "OnMutableExtension"),
          primitive_extn_accessor("extension_set", "OnSetExtension"),
          primitive_extn_accessor("extension_release", "OnReleaseExtension"),

          index_extn_accessor("repeated_extension_get", "OnGetExtension"),
          index_extn_accessor("repeated_extension_mutable",
                              "OnMutableExtension"),
          index_extn_accessor("repeated_extension_set", "OnSetExtension"),

          add_extn_accessor("repeated_extension_add", "OnAddExtension"),
          add_extn_accessor("repeated_extension_add_mutable",
                            "OnAddMutableExtension"),

          list_extn_accessor("extension_repeated_size", "OnExtensionSize"),
          list_extn_accessor("repeated_extension_list", "OnListExtension"),
          list_extn_accessor("repeated_extension_list_mutable",
                             "OnMutableListExtension"),

          // Generic accessors such as "clear".
          // TODO: Generalize clear from both repeated and non
          // repeated calls, currently their underlying memory interfaces are
          // very different. Or think of removing clear callback as no usages
          // are needed and no memory exist
          Call("extension_clear", "OnClearExtension").Suppressed(),
      });
}